

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O0

Function * __thiscall Functions::returnFunction(Functions *this,Function *function)

{
  code *pcVar1;
  __type _Var2;
  size_type sVar3;
  reference ppFVar4;
  vector<Function_*,_std::allocator<Function_*>_> local_c0;
  vector<Function_*,_std::allocator<Function_*>_> local_98;
  undefined1 local_80 [8];
  string stackFID;
  string findFID;
  int local_24;
  int i;
  Function *function_local;
  Functions *this_local;
  
  local_24 = 0;
  while( true ) {
    getFunctionStack((vector<Function_*,_std::allocator<Function_*>_> *)((long)&findFID.field_2 + 8)
                     ,this);
    sVar3 = std::vector<Function_*,_std::allocator<Function_*>_>::size
                      ((vector<Function_*,_std::allocator<Function_*>_> *)
                       ((long)&findFID.field_2 + 8));
    std::vector<Function_*,_std::allocator<Function_*>_>::~vector
              ((vector<Function_*,_std::allocator<Function_*>_> *)((long)&findFID.field_2 + 8));
    if (sVar3 <= (ulong)(long)local_24) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    (*(function->super_Statement)._vptr_Statement[3])((undefined1 *)((long)&stackFID.field_2 + 8));
    getFunctionStack(&local_98,this);
    ppFVar4 = std::vector<Function_*,_std::allocator<Function_*>_>::operator[]
                        (&local_98,(long)local_24);
    (*((*ppFVar4)->super_Statement)._vptr_Statement[3])(local_80);
    std::vector<Function_*,_std::allocator<Function_*>_>::~vector(&local_98);
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&stackFID.field_2 + 8),
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_80);
    if (_Var2) {
      getFunctionStack(&local_c0,this);
      ppFVar4 = std::vector<Function_*,_std::allocator<Function_*>_>::operator[]
                          (&local_c0,(long)local_24);
      this_local = (Functions *)*ppFVar4;
      std::vector<Function_*,_std::allocator<Function_*>_>::~vector(&local_c0);
    }
    std::__cxx11::string::~string((string *)local_80);
    std::__cxx11::string::~string((string *)(stackFID.field_2._M_local_buf + 8));
    if (_Var2) break;
    local_24 = local_24 + 1;
  }
  return (Function *)this_local;
}

Assistant:

Function *Functions::returnFunction(Function *function) {
    for(int i = 0; i < getFunctionStack().size();i++){
        std::string findFID =function->id();
        std::string stackFID = getFunctionStack()[i]->id();
        if(findFID == stackFID ) {
            return getFunctionStack()[i];
        }
    }
}